

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id)

{
  ulong uVar1;
  Question *pQVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar3;
  ulong uVar4;
  Question *local_18;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,id);
  if ((int)in_EDX < 0) {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
                *)&local_18,(uint *)(plVar3 + 8));
    pQVar2 = (Question *)&(local_18->paramExports).size_;
    if (local_18 == (Question *)0x0) {
      pQVar2 = (Question *)0x0;
    }
    (this->slots).builder.ptr = pQVar2;
  }
  else {
    uVar1 = (ulong)in_EDX;
    local_18 = (Question *)*plVar3;
    uVar4 = (plVar3[1] - (long)local_18 >> 3) * -0x3333333333333333;
    if ((uVar4 < uVar1 || uVar4 - uVar1 == 0) ||
       ((local_18[uVar1].isAwaitingReturn == false &&
        (local_18[uVar1].selfRef.ptr == (QuestionRef *)0x0)))) {
      (this->slots).builder.ptr = (Question *)0x0;
    }
    else {
      local_18 = local_18 + uVar1;
      (this->slots).builder.ptr = local_18;
    }
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>)local_18;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    if (isHigh(id)) {
      return highSlots.find(id);
    } else if (id < slots.size() && slots[id] != nullptr) {
      return slots[id];
    } else {
      return kj::none;
    }
  }